

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall
ParserTestDyndepNotSpecified::~ParserTestDyndepNotSpecified(ParserTestDyndepNotSpecified *this)

{
  ParserTest::~ParserTest(&this->super_ParserTest);
  operator_delete(this,0x248);
  return;
}

Assistant:

TEST_F(ParserTest, DyndepNotSpecified) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build result: cat in\n"));
  Edge* edge = state.GetNode("result", &state.bindings_, 0)->in_edge();
  ASSERT_FALSE(edge->dyndep_);
}